

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_clone.c
# Opt level: O3

void clone_free(t_clone *x)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  t_copy *ptVar6;
  long lVar7;
  t_copy *fatso;
  long lVar8;
  long lVar9;
  
  fatso = x->x_vec;
  if (fatso == (t_copy *)0x0) {
    return;
  }
  uVar1 = x->x_n;
  uVar5 = 0xffffffff;
  iVar4 = -1;
  iVar2 = -1;
  if ((pd_maininstance.pd_gui)->i_reloadingabstraction == (_glist *)0x0) {
LAB_0013aed2:
    iVar4 = iVar2;
    if (0 < (int)uVar1) {
      lVar8 = 0;
      lVar9 = 0;
      do {
        canvas_closebang(*(_glist **)((long)&x->x_vec->c_gl + lVar8 * 2));
        pd_free(*(t_pd **)((long)&x->x_vec->c_gl + lVar8 * 2));
        freebytes(*(void **)((long)x->x_outvec + lVar8),(long)x->x_nout * 0x18);
        lVar9 = lVar9 + 1;
        lVar7 = (long)x->x_n;
        lVar8 = lVar8 + 8;
      } while (lVar9 < lVar7);
      fatso = x->x_vec;
      goto LAB_0013af28;
    }
  }
  else if (0 < (int)uVar1) {
    uVar3 = 0;
    ptVar6 = fatso;
    do {
      if (ptVar6->c_gl == (pd_maininstance.pd_gui)->i_reloadingabstraction) {
        uVar5 = uVar3 & 0xffffffff;
      }
      uVar3 = uVar3 + 1;
      ptVar6 = ptVar6 + 1;
      iVar2 = (int)uVar5;
    } while (uVar1 != uVar3);
    goto LAB_0013aed2;
  }
  lVar7 = (long)(int)uVar1;
LAB_0013af28:
  freebytes(fatso,lVar7 << 4);
  freebytes(x->x_argv,(long)x->x_argc << 4);
  freebytes(x->x_invec,(long)x->x_nin * 0x18);
  freebytes(x->x_outvec,(long)x->x_n << 3);
  clone_voicetovis = iVar4;
  return;
}

Assistant:

static void clone_free(t_clone *x)
{
    if (x->x_vec)
    {
        int i, voicetovis = -1;
        if (THISGUI->i_reloadingabstraction)
        {
            for (i = 0; i < x->x_n; i++)
                if (x->x_vec[i].c_gl == THISGUI->i_reloadingabstraction)
                    voicetovis = i;
        }
        for (i = 0; i < x->x_n; i++)
        {
            canvas_closebang(x->x_vec[i].c_gl);
            pd_free(&x->x_vec[i].c_gl->gl_pd);
            t_freebytes(x->x_outvec[i],
                x->x_nout * sizeof(*x->x_outvec[i]));
        }
        t_freebytes(x->x_vec, x->x_n * sizeof(*x->x_vec));
        t_freebytes(x->x_argv, x->x_argc * sizeof(*x->x_argv));
        t_freebytes(x->x_invec, x->x_nin * sizeof(*x->x_invec));
        t_freebytes(x->x_outvec, x->x_n * sizeof(*x->x_outvec));
        clone_voicetovis = voicetovis;
    }
}